

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_normalizes_to_zero_var(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t x;
  uint64_t z1;
  uint64_t z0;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  secp256k1_fe *r_local;
  uint local_4;
  
  uVar1 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar2 = uVar1 & 0xfffffffffffff;
  if (uVar2 == 0 || (uVar2 ^ 0x1000003d0) == 0xfffffffffffff) {
    uVar1 = (uVar1 >> 0x34) + r->n[1];
    uVar3 = (uVar1 >> 0x34) + r->n[2];
    uVar1 = uVar1 & 0xfffffffffffff;
    uVar4 = (uVar3 >> 0x34) + r->n[3];
    uVar3 = uVar3 & 0xfffffffffffff;
    uVar5 = (uVar4 >> 0x34) + (r->n[4] & 0xffffffffffff);
    uVar4 = uVar4 & 0xfffffffffffff;
    local_4 = (uint)(uVar5 == 0 && (uVar4 == 0 && (uVar3 == 0 && (uVar1 == 0 && uVar2 == 0))) ||
                    ((uVar5 ^ 0xf000000000000) & uVar4 & uVar3 & uVar1 & (uVar2 ^ 0x1000003d0)) ==
                    0xfffffffffffff);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_fe_normalizes_to_zero_var(secp256k1_fe *r) {
    uint64_t t0, t1, t2, t3, t4;
    uint64_t z0, z1;
    uint64_t x;

    t0 = r->n[0];
    t4 = r->n[4];

    /* Reduce t4 at the start so there will be at most a single carry from the first pass */
    x = t4 >> 48;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x1000003D1ULL;

    /* z0 tracks a possible raw value of 0, z1 tracks a possible raw value of P */
    z0 = t0 & 0xFFFFFFFFFFFFFULL;
    z1 = z0 ^ 0x1000003D0ULL;

    /* Fast return path should catch the majority of cases */
    if ((z0 != 0ULL) & (z1 != 0xFFFFFFFFFFFFFULL)) {
        return 0;
    }

    t1 = r->n[1];
    t2 = r->n[2];
    t3 = r->n[3];

    t4 &= 0x0FFFFFFFFFFFFULL;

    t1 += (t0 >> 52);
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL; z0 |= t1; z1 &= t1;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL; z0 |= t2; z1 &= t2;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL; z0 |= t3; z1 &= t3;
                                                z0 |= t4; z1 &= t4 ^ 0xF000000000000ULL;

    /* ... except for a possible carry at bit 48 of t4 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t4 >> 49 == 0);

    return (z0 == 0) | (z1 == 0xFFFFFFFFFFFFFULL);
}